

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibuf.h
# Opt level: O0

void * ibuf_alloc(ibuf *ibuf,size_t size)

{
  char *local_28;
  void *ptr;
  size_t size_local;
  ibuf *ibuf_local;
  
  if (ibuf->end < ibuf->wpos + size) {
    local_28 = (char *)ibuf_reserve_slow(ibuf,size);
    if (local_28 == (char *)0x0) {
      return (void *)0x0;
    }
  }
  else {
    ibuf_unpoison_unallocated(ibuf);
    local_28 = ibuf->wpos;
  }
  ibuf->wpos = ibuf->wpos + size;
  ibuf_poison_unallocated(ibuf);
  return local_28;
}

Assistant:

static inline void *
ibuf_alloc(struct ibuf *ibuf, size_t size)
{
	void *ptr;
	if (ibuf->wpos + size <= ibuf->end) {
		/*
		 * In case of using same buffer we need to unpoison newly
		 * allocated memory after previous ibuf_alloc or poison after
		 * newly allocated memory after previous ibuf_reserve.
		 */
		ibuf_unpoison_unallocated(ibuf);
		ptr = ibuf->wpos;
	} else {
		ptr = ibuf_reserve_slow(ibuf, size);
		if (ptr == NULL)
			return NULL;
	}
	ibuf->wpos += size;
	ibuf_poison_unallocated(ibuf);
	return ptr;
}